

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::init
          (TessCoordComponentInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  deInt32 *pdVar2;
  size_type *psVar3;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar4;
  RenderTarget *renderTarget;
  long *plVar5;
  undefined8 *puVar6;
  ShaderProgram *this_01;
  SharedPtrStateBase *pSVar7;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar8;
  TestError *this_02;
  ulong *puVar9;
  Context *code;
  pointer pcVar10;
  undefined8 uVar11;
  undefined1 in_R9B;
  long lVar12;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string local_2e0;
  size_type *local_2c0;
  value_type local_2b8;
  size_type *local_298;
  value_type local_290;
  string local_270;
  string local_250;
  size_type *local_230;
  value_type local_228;
  undefined1 local_208 [32];
  ContextInfo *local_1e8;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  Context *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  ContextInfo *local_1a0;
  undefined1 local_190 [16];
  ContextInfo *local_180;
  undefined1 local_170 [16];
  ContextInfo *local_160;
  pointer local_158;
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  deUint32 local_58;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  local_180 = (ContextInfo *)local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  local_1a0 = (ContextInfo *)local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,"");
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_208,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
             this->m_spacing,this->m_winding,(uint)this->m_usePointMode,(bool)in_R9B);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x96eea1);
  pCVar8 = (ContextInfo *)(plVar5 + 2);
  if ((ContextInfo *)*plVar5 == pCVar8) {
    local_1e0._8_8_ = pCVar8->_vptr_ContextInfo;
    aStack_1d0._M_allocated_capacity = plVar5[3];
    local_1e8 = (ContextInfo *)(local_1e0 + 8);
  }
  else {
    local_1e0._8_8_ = pCVar8->_vptr_ContextInfo;
    local_1e8 = (ContextInfo *)*plVar5;
  }
  local_1e0._0_8_ = plVar5[1];
  *plVar5 = (long)pCVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  psVar3 = &local_228._M_string_length;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((size_type *)*plVar5 == puVar9) {
    local_228._M_string_length = *puVar9;
    local_228.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar5[3];
    local_228.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_230 = psVar3;
  }
  else {
    local_228._M_string_length = *puVar9;
    local_230 = (size_type *)*plVar5;
  }
  local_228._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_250,this,"gl_TessCoord.x","out_te_output.x");
  pcVar10 = (pointer)0xf;
  if (local_230 != psVar3) {
    pcVar10 = (pointer)local_228._M_string_length;
  }
  if (pcVar10 < local_228._M_dataplus._M_p + local_250._M_string_length) {
    uVar11 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar11 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_228._M_dataplus._M_p + local_250._M_string_length) goto LAB_003efce6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_003efce6:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250._M_dataplus._M_p);
  }
  local_2c0 = &local_2b8._M_string_length;
  puVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == puVar9) {
    local_2b8._M_string_length = *puVar9;
    local_2b8.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar6 + 3);
    local_2b8.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_2b8._M_string_length = *puVar9;
    local_2c0 = (size_type *)*puVar6;
  }
  local_2b8._M_dataplus._M_p = (pointer)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_270,this,"gl_TessCoord.y","out_te_output.y");
  pcVar10 = (pointer)0xf;
  if (local_2c0 != &local_2b8._M_string_length) {
    pcVar10 = (pointer)local_2b8._M_string_length;
  }
  if (pcVar10 < local_2b8._M_dataplus._M_p + local_270._M_string_length) {
    uVar11 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar11 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2b8._M_dataplus._M_p + local_270._M_string_length) goto LAB_003efdc0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2c0);
  }
  else {
LAB_003efdc0:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_270._M_dataplus._M_p);
  }
  local_298 = &local_290._M_string_length;
  puVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == puVar9) {
    local_290._M_string_length = *puVar9;
    local_290.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar6 + 3);
    local_290.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_290._M_string_length = *puVar9;
    local_298 = (size_type *)*puVar6;
  }
  local_290._M_dataplus._M_p = (pointer)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_2e0,this,"gl_TessCoord.z","out_te_output.z");
  }
  else {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,"\tout_te_output.z = 0.0f;\n","");
  }
  pcVar10 = (pointer)0xf;
  if (local_298 != &local_290._M_string_length) {
    pcVar10 = (pointer)local_290._M_string_length;
  }
  if (pcVar10 < local_290._M_dataplus._M_p + local_2e0._M_string_length) {
    uVar11 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      uVar11 = local_2e0.field_2._M_allocated_capacity;
    }
    if (local_290._M_dataplus._M_p + local_2e0._M_string_length <= (ulong)uVar11) {
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_298);
      goto LAB_003efece;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_298,(ulong)local_2e0._M_dataplus._M_p);
LAB_003efece:
  local_100._0_8_ = local_100 + 0x10;
  p_Var1 = (_Base_ptr)(plVar5 + 2);
  if ((_Base_ptr)*plVar5 == p_Var1) {
    local_100._16_8_ = *(undefined8 *)p_Var1;
    pbStack_e8 = (pointer)plVar5[3];
  }
  else {
    local_100._16_8_ = *(undefined8 *)p_Var1;
    local_100._0_8_ = (_Base_ptr)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)p_Var1;
  plVar5[1] = 0;
  *(undefined1 *)&p_Var1->_M_color = _S_red;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_1c0 = (Context *)local_1b0;
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_1b0._0_8_ = code->m_testCtx;
    local_1b0._8_8_ = plVar5[3];
  }
  else {
    local_1b0._0_8_ = code->m_testCtx;
    local_1c0 = (Context *)*plVar5;
  }
  local_1b8 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_Base_ptr)local_100._0_8_ != (_Base_ptr)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != &local_290._M_string_length) {
    operator_delete(local_298,(ulong)(local_290._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != &local_2b8._M_string_length) {
    operator_delete(local_2c0,(ulong)(local_2b8._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != psVar3) {
    operator_delete(local_230,(ulong)(local_228._M_string_length + 1));
  }
  if (local_1e8 != (ContextInfo *)(local_1e0 + 8)) {
    operator_delete(local_1e8,local_1e0._8_8_ + 1);
  }
  if ((Context *)local_208._0_8_ != (Context *)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  local_208._0_8_ = (Context *)(local_208 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)this_00,(Context *)local_180,(char *)code);
  local_298 = (size_type *)((ulong)local_298 & 0xffffffff00000000);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_250._M_dataplus._M_p,
             local_250._M_dataplus._M_p + local_250._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_298 & 0xffffffff) * 0x18),&local_290);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_270,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_1a0,(char *)code);
  local_2c0 = (size_type *)CONCAT44(local_2c0._4_4_,3);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_270._M_dataplus._M_p,
             local_270._M_dataplus._M_p + local_270._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2c0 & 0xffffffff) * 0x18),&local_2b8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2e0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_1c0,
             (char *)code);
  local_230 = (size_type *)CONCAT44(local_230._4_4_,4);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_230 & 0xffffffff) * 0x18),&local_228);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&local_120,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_208._0_8_,(char *)code);
  local_1e8 = (ContextInfo *)CONCAT44(local_1e8._4_4_,1);
  local_1e0._0_8_ = &aStack_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,local_120._M_allocated_capacity,
             local_120._8_8_ + local_120._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_1e8 & 0xffffffff) * 0x18),(value_type *)local_1e0);
  local_160 = (ContextInfo *)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"out_te_output","");
  local_140._0_8_ = (pointer)(local_140 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_160,
             (undefined1 *)((long)&local_160->_vptr_ContextInfo + (long)&local_158->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,(value_type *)local_140);
  local_58 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_100);
  pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar7->strongRefCount = 0;
  pSVar7->weakRefCount = 0;
  pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b47b90;
  pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  pSVar7->strongRefCount = 1;
  pSVar7->weakRefCount = 1;
  pSVar4 = (this->m_program).m_state;
  if (pSVar4 != pSVar7) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar2 = &pSVar4->strongRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar2 = &((this->m_program).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        pSVar4 = (this->m_program).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_01;
    (this->m_program).m_state = pSVar7;
    LOCK();
    pSVar7->strongRefCount = pSVar7->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar2 = &((this->m_program).m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar2 = &pSVar7->strongRefCount;
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[2])(pSVar7);
  }
  LOCK();
  pdVar2 = &pSVar7->weakRefCount;
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[1])(pSVar7);
  }
  if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
  }
  if (local_160 != (ContextInfo *)local_150) {
    operator_delete(local_160,(ulong)((long)(_Rb_tree_color *)local_150._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &aStack_1d0) {
    operator_delete((void *)local_1e0._0_8_,aStack_1d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_allocated_capacity != &local_110) {
    operator_delete((void *)local_120._M_allocated_capacity,
                    (ulong)(local_110._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT44(local_228.field_2._M_allocated_capacity._4_4_,
                             local_228.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                             local_2b8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT44(local_290.field_2._M_allocated_capacity._4_4_,
                             local_290.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if ((Context *)local_208._0_8_ != (Context *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if (local_1c0 != (Context *)local_1b0) {
      operator_delete(local_1c0,(ulong)((long)(Platform **)local_1b0._0_8_ + 1));
    }
    if (local_1a0 != (ContextInfo *)local_190) {
      operator_delete(local_1a0,(ulong)((long)(Platform **)local_190._0_8_ + 1));
    }
    pCVar8 = (ContextInfo *)local_170;
    if (local_180 != pCVar8) {
      operator_delete(local_180,(ulong)((long)(Platform **)local_170._0_8_ + 1));
      pCVar8 = extraout_RAX;
    }
    return (int)pCVar8;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x13bd);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessCoordComponentInvarianceCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec3 out_te_output;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tessEvalOutputComponentStatements("gl_TessCoord.x", "out_te_output.x")
												 + tessEvalOutputComponentStatements("gl_TessCoord.y", "out_te_output.y")

												 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
													tessEvalOutputComponentStatements("gl_TessCoord.z", "out_te_output.z") :
													"	out_te_output.z = 0.0f;\n") +
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_output")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}